

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

int TPZFMatrix<double>::Substitution
              (double *ptr,int64_t rows,TPZFMatrix<double> *B,TPZVec<int> *index)

{
  double dVar1;
  long lVar2;
  TPZFMatrix<double> *this;
  ostream *poVar3;
  int64_t iVar4;
  void *this_00;
  int *piVar5;
  double *pdVar6;
  TPZVec<int> *in_RCX;
  TPZFMatrix<double> *in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar7;
  TPZVec<double> v;
  double sum;
  int64_t j;
  int64_t i;
  TPZFMatrix<double> *b;
  int64_t in_stack_fffffffffffffef8;
  TPZVec<double> *in_stack_ffffffffffffff00;
  TPZVec<double> local_68;
  double local_48;
  long local_40;
  long local_38;
  TPZFMatrix<double> *local_30;
  TPZVec<int> *local_28;
  long local_18;
  long local_10;
  int local_4;
  
  if (in_RDX == (TPZFMatrix<double> *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "static int TPZFMatrix<double>::Substitution(const TVar *, int64_t, TPZFMatrix<TVar> *, const TPZVec<int> &) [TVar = double]"
                            );
    poVar3 = std::operator<<(poVar3,"TPZFMatrix<>*B eh nulo");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
  }
  else {
    local_30 = in_RDX;
    local_28 = in_RCX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar4 = TPZVec<int>::NElements(in_RCX);
    if ((iVar4 == local_18) &&
       (iVar4 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30), iVar4 == local_18)) {
      local_48 = 0.0;
      TPZVec<double>::TPZVec(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      for (local_38 = 0; this = local_30, local_38 < local_18; local_38 = local_38 + 1) {
        piVar5 = TPZVec<int>::operator[](local_28,local_38);
        pdVar6 = operator()(this,(long)*piVar5);
        dVar1 = *pdVar6;
        pdVar6 = TPZVec<double>::operator[](&local_68,local_38);
        *pdVar6 = dVar1;
      }
      for (local_38 = 0; lVar2 = local_18, local_38 < local_18; local_38 = local_38 + 1) {
        local_48 = 0.0;
        for (local_40 = 0; dVar1 = local_48, local_40 < local_38; local_40 = local_40 + 1) {
          dVar1 = *(double *)(local_10 + (local_40 * local_18 + local_38) * 8);
          pdVar6 = TPZVec<double>::operator[](&local_68,local_40);
          local_48 = dVar1 * *pdVar6 + local_48;
        }
        pdVar6 = TPZVec<double>::operator[](&local_68,local_38);
        *pdVar6 = *pdVar6 - dVar1;
      }
      while (local_38 = lVar2 + -1, -1 < local_38) {
        local_48 = 0.0;
        for (local_40 = lVar2; local_40 < local_18; local_40 = local_40 + 1) {
          dVar1 = *(double *)(local_10 + (local_40 * local_18 + local_38) * 8);
          pdVar6 = TPZVec<double>::operator[](&local_68,local_40);
          local_48 = dVar1 * *pdVar6 + local_48;
        }
        pdVar6 = TPZVec<double>::operator[](&local_68,local_38);
        dVar7 = *pdVar6 - local_48;
        dVar1 = *(double *)(local_10 + (local_38 * local_18 + local_38) * 8);
        pdVar6 = TPZVec<double>::operator[](&local_68,local_38);
        *pdVar6 = dVar7 / dVar1;
        lVar2 = local_38;
      }
      for (local_38 = 0; local_38 < local_18; local_38 = local_38 + 1) {
        pdVar6 = TPZVec<double>::operator[](&local_68,local_38);
        in_stack_ffffffffffffff00 = (TPZVec<double> *)*pdVar6;
        pdVar6 = operator()(local_30,local_38);
        *pdVar6 = (double)in_stack_ffffffffffffff00;
      }
      local_4 = 1;
      TPZVec<double>::~TPZVec(in_stack_ffffffffffffff00);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_266cdb);
      poVar3 = std::operator<<(poVar3,"this->fIndex = ");
      iVar4 = TPZVec<int>::NElements(local_28);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
      poVar3 = std::operator<<(poVar3,"  b = ");
      iVar4 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30);
      this_00 = (void *)std::ostream::operator<<(poVar3,iVar4);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int TPZFMatrix<TVar>::Substitution(const TVar *ptr, int64_t rows, TPZFMatrix<TVar> *B, const TPZVec<int> &index )
{
    
    if(!B){
        PZError << __PRETTY_FUNCTION__ << "TPZFMatrix<>*B eh nulo" << endl;
        return 0;
    }
    
    TPZFMatrix<TVar> &b = *B;
    
    
    
    if (index.NElements() != rows || b.Rows() != rows)
    {
        cout << "TMatrix::Substituicao ERRO : vetores com dimensões incompativeis:\n"
        << "this->fIndex = " << index.NElements() << "  b = " << b.Rows() << endl;
        return 0;
    }
    
    int64_t i,j;
    TVar sum = 0;
    
    TPZVec<TVar> v(rows);
    
    
    for (i=0;i<rows;i++)
    {
        v[i] = b(index[i]);
    }
    
    //Ly=b
    for (i=0;i<rows;i++)
    {
        sum = 0.;
        for (j=0;j<(i);j++) sum += SELECTEL(ptr,rows,i,j) * v[j];
        v[i] -= sum;
    }
    
    //Ux=y
    for (i=(rows-1);i>-1;i--)
    {
        sum = 0.;
        for (j=(i+1);j<rows;j++) sum += SELECTEL(ptr,rows,i,j) * v[j];
        v[i] = (v[i] - sum) / SELECTEL(ptr,rows,i,i);
    }
    
    for (i=0;i<rows;i++) b(i) = v[i];
    return 1;
}